

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O3

int ffppn(fitsfile *fptr,int datatype,LONGLONG firstelem,LONGLONG nelem,void *array,void *nulval,
         int *status)

{
  if (0 < *status) {
    return *status;
  }
  if (nulval == (void *)0x0) {
    ffppr(fptr,datatype,firstelem,nelem,array,status);
    goto LAB_001a0aea;
  }
  if (datatype < 0x28) {
    if (datatype < 0x15) {
      if (datatype == 0xb) {
        ffppnb(fptr,1,firstelem,nelem,(uchar *)array,*nulval,status);
        goto LAB_001a0aea;
      }
      if (datatype == 0xc) {
        ffppnsb(fptr,1,firstelem,nelem,(char *)array,*nulval,status);
        goto LAB_001a0aea;
      }
      if (datatype == 0x14) {
        ffppnui(fptr,1,firstelem,nelem,(unsigned_short *)array,*nulval,status);
        goto LAB_001a0aea;
      }
    }
    else {
      if (datatype == 0x15) {
        ffppni(fptr,1,firstelem,nelem,(short *)array,*nulval,status);
        goto LAB_001a0aea;
      }
      if (datatype == 0x1e) {
        ffppnuk(fptr,1,firstelem,nelem,(uint *)array,*nulval,status);
        goto LAB_001a0aea;
      }
      if (datatype == 0x1f) {
        ffppnk(fptr,1,firstelem,nelem,(int *)array,*nulval,status);
        goto LAB_001a0aea;
      }
    }
  }
  else if (datatype < 0x50) {
    if (datatype == 0x28) {
      ffppnuj(fptr,1,firstelem,nelem,(unsigned_long *)array,*nulval,status);
      goto LAB_001a0aea;
    }
    if (datatype == 0x29) {
      ffppnj(fptr,1,firstelem,nelem,(long *)array,*nulval,status);
      goto LAB_001a0aea;
    }
    if (datatype == 0x2a) {
      ffppne(fptr,1,firstelem,nelem,(float *)array,*nulval,status);
      goto LAB_001a0aea;
    }
  }
  else {
    if (datatype == 0x50) {
      ffppnujj(fptr,1,firstelem,nelem,(ULONGLONG *)array,*nulval,status);
      goto LAB_001a0aea;
    }
    if (datatype == 0x51) {
      ffppnjj(fptr,1,firstelem,nelem,(LONGLONG *)array,*nulval,status);
      goto LAB_001a0aea;
    }
    if (datatype == 0x52) {
      ffppnd(fptr,1,firstelem,nelem,(double *)array,*nulval,status);
      goto LAB_001a0aea;
    }
  }
  *status = 0x19a;
LAB_001a0aea:
  return *status;
}

Assistant:

int ffppn(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int  datatype,   /* I - datatype of the value                   */
            LONGLONG  firstelem, /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,     /* I - number of values to write               */
            void  *array,    /* I - array of values that are written        */
            void  *nulval,   /* I - pointer to the null value               */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to the primary array.  The datatype of the
  input array is defined by the 2nd argument. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).

*/
{
    long group = 1;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (nulval == NULL)  /* null value not defined? */
    {
        ffppr(fptr, datatype, firstelem, nelem, array, status);
        return(*status);
    }

    if (datatype == TBYTE)
    {
      ffppnb(fptr, group, firstelem, nelem, (unsigned char *) array, 
             *(unsigned char *) nulval, status);
    }
    else if (datatype == TSBYTE)
    {
      ffppnsb(fptr, group, firstelem, nelem, (signed char *) array, 
             *(signed char *) nulval, status);
    }
    else if (datatype == TUSHORT)
    {
      ffppnui(fptr, group, firstelem, nelem, (unsigned short *) array,
              *(unsigned short *) nulval,status);
    }
    else if (datatype == TSHORT)
    {
      ffppni(fptr, group, firstelem, nelem, (short *) array,
             *(short *) nulval, status);
    }
    else if (datatype == TUINT)
    {
      ffppnuk(fptr, group, firstelem, nelem, (unsigned int *) array,
             *(unsigned int *) nulval, status);
    }
    else if (datatype == TINT)
    {
      ffppnk(fptr, group, firstelem, nelem, (int *) array,
             *(int *) nulval, status);
    }
    else if (datatype == TULONG)
    {
      ffppnuj(fptr, group, firstelem, nelem, (unsigned long *) array,
              *(unsigned long *) nulval,status);
    }
    else if (datatype == TLONG)
    {
      ffppnj(fptr, group, firstelem, nelem, (long *) array,
             *(long *) nulval, status);
    }
    else if (datatype == TULONGLONG)
    {
      ffppnujj(fptr, group, firstelem, nelem, (ULONGLONG *) array,
             *(ULONGLONG *) nulval, status);
    }
    else if (datatype == TLONGLONG)
    {
      ffppnjj(fptr, group, firstelem, nelem, (LONGLONG *) array,
             *(LONGLONG *) nulval, status);
    }
    else if (datatype == TFLOAT)
    {
      ffppne(fptr, group, firstelem, nelem, (float *) array,
             *(float *) nulval, status);
    }
    else if (datatype == TDOUBLE)
    {
      ffppnd(fptr, group, firstelem, nelem, (double *) array,
             *(double *) nulval, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}